

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::ParsedScene::Camera(ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  ParsedParameter *pPVar1;
  ParsedParameter *pPVar2;
  ParsedParameter *pPVar3;
  ParsedParameter *pPVar4;
  ParsedParameter *pPVar5;
  ParsedParameter *pPVar6;
  size_t sVar7;
  size_t sVar8;
  pointer pcVar9;
  size_type sVar10;
  size_type sVar11;
  undefined8 uVar12;
  memory_resource *pmVar13;
  ParsedParameter **ppPVar14;
  ParsedParameter *pPVar15;
  ParsedParameter *pPVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  RGBColorSpace *pRVar25;
  size_t sVar26;
  char *pcVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  FileLoc loc_00;
  mapped_type *pmVar33;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary dict;
  TransformSet tInv_1;
  TransformSet worldFromCamera;
  CameraTransform cameraTransform;
  ParameterDictionary local_998;
  ParameterDictionary local_930;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_8c8;
  undefined1 local_868 [136];
  size_t sStack_7e0;
  char *pcStack_7d8;
  Float aFStack_7d0 [2];
  Float aFStack_7c8 [2];
  Float aFStack_7c0 [2];
  Float aFStack_7b8 [2];
  Float aFStack_7b0 [2];
  Float local_7a8 [2];
  Float aFStack_7a0 [2];
  Float aFStack_798 [2];
  Float aFStack_790 [2];
  Float aFStack_788 [2];
  Float aFStack_780 [2];
  Float aFStack_778 [2];
  Float aFStack_770 [184];
  _Alloc_hider local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  Transform local_468;
  pointer local_3e8;
  size_type sStack_3e0;
  size_type sStack_3d8;
  Float aFStack_3d0 [2];
  memory_resource *pmStack_3c8;
  ParsedParameter **ppPStack_3c0;
  ParsedParameter *pPStack_3b8;
  ParsedParameter *pPStack_3b0;
  ParsedParameter *local_3a8;
  ParsedParameter *pPStack_3a0;
  ParsedParameter *pPStack_398;
  ParsedParameter *pPStack_390;
  ParsedParameter *pPStack_388;
  ParsedParameter *pPStack_380;
  size_t sStack_378;
  size_t sStack_370;
  undefined1 local_368 [704];
  ParsedParameter *pPStack_a8;
  ParsedParameter *pPStack_a0;
  ParsedParameter *pPStack_98;
  ParsedParameter *pPStack_90;
  ParsedParameter *pPStack_88;
  size_t sStack_80;
  size_t sStack_78;
  pointer local_70;
  size_type sStack_68;
  size_type sStack_60;
  Float aFStack_58 [2];
  memory_resource *pmStack_50;
  ParsedParameter **ppPStack_48;
  ParsedParameter *pPStack_40;
  ParsedParameter *pPStack_38;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_8c8,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_930,&local_8c8,(this->graphicsState).colorSpace);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_8c8);
  if (this->currentBlock != WorldBlock) {
    pPVar1 = *(ParsedParameter **)(this->graphicsState).ctm.t[0].m.m[0];
    pPVar2 = *(ParsedParameter **)((this->graphicsState).ctm.t[0].m.m[0] + 2);
    pPVar3 = *(ParsedParameter **)(this->graphicsState).ctm.t[0].m.m[1];
    pPVar4 = *(ParsedParameter **)((this->graphicsState).ctm.t[0].m.m[1] + 2);
    pPVar5 = *(ParsedParameter **)(this->graphicsState).ctm.t[0].m.m[2];
    pPVar6 = *(ParsedParameter **)((this->graphicsState).ctm.t[0].m.m[2] + 2);
    sVar7 = *(size_t *)(this->graphicsState).ctm.t[0].m.m[3];
    sVar8 = *(size_t *)((this->graphicsState).ctm.t[0].m.m[3] + 2);
    pcVar9 = *(pointer *)(this->graphicsState).ctm.t[0].mInv.m[0];
    sVar10 = *(size_type *)((this->graphicsState).ctm.t[0].mInv.m[0] + 2);
    sVar11 = *(size_type *)(this->graphicsState).ctm.t[0].mInv.m[1];
    uVar12 = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[1] + 2);
    pmVar13 = *(memory_resource **)(this->graphicsState).ctm.t[0].mInv.m[2];
    ppPVar14 = *(ParsedParameter ***)((this->graphicsState).ctm.t[0].mInv.m[2] + 2);
    pPVar15 = *(ParsedParameter **)(this->graphicsState).ctm.t[0].mInv.m[3];
    pPVar16 = *(ParsedParameter **)((this->graphicsState).ctm.t[0].mInv.m[3] + 2);
    uVar17 = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[0];
    uVar18 = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[0] + 2);
    uVar19 = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[1];
    uVar20 = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[1] + 2);
    uVar21 = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[2];
    uVar22 = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[2] + 2);
    uVar23 = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[3];
    uVar24 = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[3] + 2);
    pRVar25 = *(RGBColorSpace **)(this->graphicsState).ctm.t[1].mInv.m[0];
    sVar26 = *(size_t *)((this->graphicsState).ctm.t[1].mInv.m[0] + 2);
    pcVar27 = *(char **)(this->graphicsState).ctm.t[1].mInv.m[1];
    uVar28 = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[1] + 2);
    uVar29 = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[2];
    uVar30 = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[2] + 2);
    uVar31 = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[3];
    uVar32 = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[3] + 2);
    pbrt::Transform::Transform(&local_468);
    pbrt::Transform::Transform((Transform *)&local_3e8);
    local_468.m.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[0];
    local_468.m.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[0] + 2);
    local_468.m.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[1];
    local_468.m.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[1] + 2);
    local_468.m.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[2];
    local_468.m.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[2] + 2);
    local_468.m.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[3];
    local_468.m.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[3] + 2);
    local_468.mInv.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[0];
    local_468.mInv.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[0] + 2);
    local_468.mInv.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[1];
    local_468.mInv.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[1] + 2);
    local_468.mInv.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[2];
    local_468.mInv.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[2] + 2);
    local_468.mInv.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[3];
    local_468.mInv.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[3] + 2);
    local_868._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[0];
    local_868._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[0] + 2);
    local_868._16_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[1];
    local_868._24_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[1] + 2);
    local_868._32_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[2];
    local_868._40_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[2] + 2);
    local_868._48_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[3];
    local_868._56_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[3] + 2);
    local_868._64_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[0];
    local_868._72_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[0] + 2);
    local_868._80_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[1];
    local_868._88_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[1] + 2);
    local_868._96_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[2];
    local_868._104_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[2] + 2);
    local_868._112_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[3];
    local_868._120_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[3] + 2);
    local_3e8 = (pointer)local_868._0_8_;
    sStack_3e0 = local_868._8_8_;
    sStack_3d8 = local_868._16_8_;
    aFStack_3d0 = (Float  [2])local_868._24_8_;
    pmStack_3c8 = (memory_resource *)local_868._32_8_;
    ppPStack_3c0 = (ParsedParameter **)local_868._40_8_;
    pPStack_3b8 = (ParsedParameter *)local_868._48_8_;
    pPStack_3b0 = (ParsedParameter *)local_868._56_8_;
    local_3a8 = (ParsedParameter *)local_868._64_8_;
    pPStack_3a0 = (ParsedParameter *)local_868._72_8_;
    pPStack_398 = (ParsedParameter *)local_868._80_8_;
    pPStack_390 = (ParsedParameter *)local_868._88_8_;
    pPStack_388 = (ParsedParameter *)local_868._96_8_;
    pPStack_380 = (ParsedParameter *)local_868._104_8_;
    sStack_378 = local_868._112_8_;
    sStack_370 = local_868._120_8_;
    pbrt::Transform::Transform((Transform *)local_868);
    pbrt::Transform::Transform((Transform *)(local_868 + 0x80));
    local_868._0_8_ = pcVar9;
    local_868._8_8_ = sVar10;
    local_868._16_8_ = sVar11;
    local_868._24_8_ = uVar12;
    local_868._32_8_ = pmVar13;
    local_868._40_8_ = ppPVar14;
    local_868._48_8_ = pPVar15;
    local_868._56_8_ = pPVar16;
    local_868._64_8_ = pPVar1;
    local_868._72_8_ = pPVar2;
    local_868._80_8_ = pPVar3;
    local_868._88_8_ = pPVar4;
    local_868._96_8_ = pPVar5;
    local_868._104_8_ = pPVar6;
    local_868._112_8_ = sVar7;
    local_868._120_8_ = sVar8;
    local_868._128_8_ = pRVar25;
    sStack_7e0 = sVar26;
    pcStack_7d8 = pcVar27;
    aFStack_7d0 = (Float  [2])uVar28;
    aFStack_7c8 = (Float  [2])uVar29;
    aFStack_7c0 = (Float  [2])uVar30;
    aFStack_7b8 = (Float  [2])uVar31;
    aFStack_7b0 = (Float  [2])uVar32;
    local_7a8 = (Float  [2])uVar17;
    aFStack_7a0 = (Float  [2])uVar18;
    aFStack_798 = (Float  [2])uVar19;
    aFStack_790 = (Float  [2])uVar20;
    aFStack_788 = (Float  [2])uVar21;
    aFStack_780 = (Float  [2])uVar22;
    aFStack_778 = (Float  [2])uVar23;
    aFStack_770._0_8_ = uVar24;
    local_368._0_8_ = local_368 + 0x10;
    local_368._8_8_ = sVar26;
    local_368._16_8_ = pcVar27;
    local_368._24_8_ = uVar28;
    local_368._32_8_ = uVar29;
    local_368._40_8_ = uVar30;
    local_368._48_8_ = uVar31;
    local_368._56_8_ = uVar32;
    local_368._64_8_ = uVar17;
    local_368._72_8_ = uVar18;
    local_368._80_8_ = uVar19;
    local_368._88_8_ = uVar20;
    local_368._96_8_ = uVar21;
    local_368._104_8_ = uVar22;
    local_368._112_8_ = uVar23;
    local_368._120_8_ = uVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"camera","");
    pmVar33 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
              ::operator[](&this->namedCoordinateSystems,(key_type *)local_368);
    *(Float (*) [2])pmVar33->t[1].mInv.m[0] = local_7a8;
    *(Float (*) [2])(pmVar33->t[1].mInv.m[0] + 2) = aFStack_7a0;
    *(Float (*) [2])pmVar33->t[1].mInv.m[1] = aFStack_798;
    *(Float (*) [2])(pmVar33->t[1].mInv.m[1] + 2) = aFStack_790;
    *(Float (*) [2])pmVar33->t[1].mInv.m[2] = aFStack_788;
    *(Float (*) [2])(pmVar33->t[1].mInv.m[2] + 2) = aFStack_780;
    *(Float (*) [2])pmVar33->t[1].mInv.m[3] = aFStack_778;
    *(undefined8 *)(pmVar33->t[1].mInv.m[3] + 2) = aFStack_770._0_8_;
    *(undefined8 *)pmVar33->t[1].m.m[0] = local_868._128_8_;
    *(size_t *)(pmVar33->t[1].m.m[0] + 2) = sStack_7e0;
    *(char **)pmVar33->t[1].m.m[1] = pcStack_7d8;
    *(Float (*) [2])(pmVar33->t[1].m.m[1] + 2) = aFStack_7d0;
    *(Float (*) [2])pmVar33->t[1].m.m[2] = aFStack_7c8;
    *(Float (*) [2])(pmVar33->t[1].m.m[2] + 2) = aFStack_7c0;
    *(Float (*) [2])pmVar33->t[1].m.m[3] = aFStack_7b8;
    *(Float (*) [2])(pmVar33->t[1].m.m[3] + 2) = aFStack_7b0;
    *(undefined8 *)pmVar33->t[0].mInv.m[0] = local_868._64_8_;
    *(undefined8 *)(pmVar33->t[0].mInv.m[0] + 2) = local_868._72_8_;
    *(undefined8 *)pmVar33->t[0].mInv.m[1] = local_868._80_8_;
    *(undefined8 *)(pmVar33->t[0].mInv.m[1] + 2) = local_868._88_8_;
    *(undefined8 *)pmVar33->t[0].mInv.m[2] = local_868._96_8_;
    *(undefined8 *)(pmVar33->t[0].mInv.m[2] + 2) = local_868._104_8_;
    *(undefined8 *)pmVar33->t[0].mInv.m[3] = local_868._112_8_;
    *(undefined8 *)(pmVar33->t[0].mInv.m[3] + 2) = local_868._120_8_;
    *(undefined8 *)pmVar33->t[0].m.m[0] = local_868._0_8_;
    *(undefined8 *)(pmVar33->t[0].m.m[0] + 2) = local_868._8_8_;
    *(undefined8 *)pmVar33->t[0].m.m[1] = local_868._16_8_;
    *(undefined8 *)(pmVar33->t[0].m.m[1] + 2) = local_868._24_8_;
    *(undefined8 *)pmVar33->t[0].m.m[2] = local_868._32_8_;
    *(undefined8 *)(pmVar33->t[0].m.m[2] + 2) = local_868._40_8_;
    *(undefined8 *)pmVar33->t[0].m.m[3] = local_868._48_8_;
    *(undefined8 *)(pmVar33->t[0].m.m[3] + 2) = local_868._56_8_;
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
    }
    AnimatedTransform::AnimatedTransform
              ((AnimatedTransform *)local_868,&local_468,(this->graphicsState).transformStartTime,
               (Transform *)&local_3e8,(this->graphicsState).transformEndTime);
    CameraTransform::CameraTransform((CameraTransform *)local_368,(AnimatedTransform *)local_868);
    local_868._0_8_ = local_70;
    local_868._8_8_ = sStack_68;
    local_868._16_8_ = sStack_60;
    local_868._24_4_ = aFStack_58[0];
    local_868._28_4_ = aFStack_58[1];
    local_868._32_8_ = pmStack_50;
    local_868._40_8_ = ppPStack_48;
    local_868._48_8_ = pPStack_40;
    local_868._56_8_ = pPStack_38;
    local_868._64_8_ = local_368._696_8_;
    local_868._72_8_ = pPStack_a8;
    local_868._80_8_ = pPStack_a0;
    local_868._88_8_ = pPStack_98;
    local_868._96_8_ = pPStack_90;
    local_868._104_8_ = pPStack_88;
    local_868._112_8_ = sStack_80;
    local_868._120_8_ = sStack_78;
    *(undefined8 *)(this->renderFromWorld).mInv.m[0] = local_368._696_8_;
    *(ParsedParameter **)((this->renderFromWorld).mInv.m[0] + 2) = pPStack_a8;
    *(ParsedParameter **)(this->renderFromWorld).mInv.m[1] = pPStack_a0;
    *(ParsedParameter **)((this->renderFromWorld).mInv.m[1] + 2) = pPStack_98;
    *(ParsedParameter **)(this->renderFromWorld).mInv.m[2] = pPStack_90;
    *(ParsedParameter **)((this->renderFromWorld).mInv.m[2] + 2) = pPStack_88;
    *(size_t *)(this->renderFromWorld).mInv.m[3] = sStack_80;
    *(size_t *)((this->renderFromWorld).mInv.m[3] + 2) = sStack_78;
    *(pointer *)(this->renderFromWorld).m.m[0] = local_70;
    *(size_type *)((this->renderFromWorld).m.m[0] + 2) = sStack_68;
    *(size_type *)(this->renderFromWorld).m.m[1] = sStack_60;
    *(Float (*) [2])((this->renderFromWorld).m.m[1] + 2) = aFStack_58;
    *(memory_resource **)(this->renderFromWorld).m.m[2] = pmStack_50;
    *(ParsedParameter ***)((this->renderFromWorld).m.m[2] + 2) = ppPStack_48;
    *(ParsedParameter **)(this->renderFromWorld).m.m[3] = pPStack_40;
    *(ParsedParameter **)((this->renderFromWorld).m.m[3] + 2) = pPStack_38;
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_998.params,&local_930.params);
    local_998.colorSpace = local_930.colorSpace;
    loc_00.filename._M_str = (char *)params.ptr;
    loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
    loc_00._16_8_ = params.field_2.fixed[0];
    CameraSceneEntity::CameraSceneEntity
              ((CameraSceneEntity *)local_868,name,&local_998,loc_00,(CameraTransform *)local_368,
               &(this->graphicsState).currentOutsideMedium);
    std::__cxx11::string::operator=((string *)&this->camera,(string *)local_868);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::operator=(&(this->camera).super_SceneEntity.parameters.params,
                (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 *)(local_868 + 0x20));
    (this->camera).super_SceneEntity.parameters.colorSpace = (RGBColorSpace *)local_868._128_8_;
    (this->camera).super_SceneEntity.loc.filename._M_len = sStack_7e0;
    (this->camera).super_SceneEntity.loc.filename._M_str = pcStack_7d8;
    (this->camera).super_SceneEntity.loc.line = (int)aFStack_7d0[0];
    (this->camera).super_SceneEntity.loc.column = (int)aFStack_7d0[1];
    memcpy(&(this->camera).cameraTransform,aFStack_7c8,0x338);
    std::__cxx11::string::operator=((string *)&(this->camera).medium,(string *)&local_490);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_p != &local_480) {
      operator_delete(local_490._M_p,local_480._M_allocated_capacity + 1);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                      *)(local_868 + 0x20));
    if ((undefined1 *)local_868._0_8_ != local_868 + 0x10) {
      operator_delete((void *)local_868._0_8_,local_868._16_8_ + 1);
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_998.params);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_930.params);
    return;
  }
  ErrorExit<char_const(&)[7]>
            ((FileLoc *)&params,"Options cannot be set inside world block; \"%s\" is not allowed.",
             (char (*) [7])0x2cb39a5);
}

Assistant:

void ParsedScene::Camera(const std::string &name, ParsedParameterVector params,
                         FileLoc loc) {
    ParameterDictionary dict(std::move(params), graphicsState.colorSpace);

    VERIFY_OPTIONS("Camera");

    TransformSet cameraFromWorld = graphicsState.ctm;
    TransformSet worldFromCamera = Inverse(graphicsState.ctm);
    namedCoordinateSystems["camera"] = Inverse(cameraFromWorld);

    CameraTransform cameraTransform(
        AnimatedTransform(worldFromCamera[0], graphicsState.transformStartTime,
                          worldFromCamera[1], graphicsState.transformEndTime));
    renderFromWorld = cameraTransform.RenderFromWorld();

    camera = CameraSceneEntity(name, std::move(dict), loc, cameraTransform,
                               graphicsState.currentOutsideMedium);
}